

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_setup_one_cvm(APITests *this)

{
  int iVar1;
  string local_60;
  string local_40;
  
  GPIO::setmode(CVM);
  iVar1 = GPIO::getmode();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  assert::is_true(iVar1 == 3,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  GPIO::setup((string *)&(this->pin_data).cvm_pin,IN,-1);
  GPIO::cleanup();
  iVar1 = GPIO::getmode();
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  assert::is_true(iVar1 == 4,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_setup_one_cvm()
    {
        GPIO::setmode(GPIO::CVM);
        assert::is_true(GPIO::getmode() == GPIO::CVM);
        GPIO::setup(pin_data.cvm_pin, GPIO::IN);
        GPIO::cleanup();
        assert::is_true(GPIO::getmode() == GPIO::NumberingModes::None);
    }